

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
  PVar1;
  _Vector_base<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
  _Stack_28;
  
  ValueArray<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>>
  ::
  MakeVector<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>,0ul>
            (&_Stack_28);
  ValuesIn<std::vector<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>,std::allocator<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>>>>
            ((testing *)this,
             (vector<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
              *)&_Stack_28);
  std::
  _Vector_base<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
  ::~_Vector_base(&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }